

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plastic.hpp
# Opt level: O0

Color __thiscall
PlasticBSDF::sample_f
          (PlasticBSDF *this,Color *albedo,vec3f *wo,vec3f *wi,float *pdf,bool *isDirac,
          Sampler *sampler)

{
  undefined1 (*in_RCX) [12];
  float *in_RDX;
  float *in_R8;
  undefined1 *in_R9;
  float fVar1;
  undefined1 auVar2 [12];
  Color CVar3;
  long *in_stack_00000008;
  float r;
  vec3f *in_stack_00000098;
  Color *in_stack_000000a8;
  PlasticBSDF *in_stack_000000b0;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  vec3f local_80 [4];
  vec3f local_50;
  float local_44;
  undefined1 *local_40;
  float *local_38;
  undefined1 (*local_30) [12];
  float *local_28;
  vec3f local_c;
  
  local_40 = in_R9;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_44 = DielectricBRDF::reflectivity(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
  fVar1 = (float)(**(code **)*in_stack_00000008)();
  if (local_44 <= fVar1) {
    *local_40 = 0;
    auVar2 = (**(code **)(*in_stack_00000008 + 0x30))();
    *local_30 = auVar2;
    *local_38 = ((1.0 - local_44) * *(float *)(*local_30 + 8)) / PI;
    if (local_28[2] <= 0.0 && local_28[2] != 0.0) {
      *(float *)(*local_30 + 8) = *(float *)(*local_30 + 8) * -1.0;
    }
    CVar3 = f(in_stack_000000b0,in_stack_000000a8,(vec3f *)sampler,in_stack_00000098);
    local_80[0]._0_8_ = CVar3._0_8_;
    local_c.x = local_80[0].x;
    local_c.y = local_80[0].y;
    local_80[0].z = CVar3.z;
    local_c.z = local_80[0].z;
  }
  else {
    *local_38 = local_44;
    *local_40 = 1;
    vec3f::vec3f(&local_50,-*local_28,-local_28[1],local_28[2]);
    *(float *)((long)local_30 + 0) = local_50.x;
    *(float *)((long)local_30 + 4) = local_50.y;
    *(float *)(*local_30 + 8) = local_50.z;
    vec3f::vec3f(&local_c,local_44 / ABS(*(float *)(*local_30 + 8)));
  }
  CVar3.z = local_c.z;
  CVar3.x = local_c.x;
  CVar3.y = local_c.y;
  return CVar3;
}

Assistant:

Color sample_f(const Color& albedo, const vec3f& wo, vec3f& wi, float& pdf, bool& isDirac, Sampler& sampler) const
	{
		float r = DielectricBRDF::reflectivity(fabs(wo.z), IOR);
		// specular reflection
		if (sampler.get1f() < r) {
			pdf = r;
			isDirac = true;
			wi = vec3f(-wo.x, -wo.y, wo.z);
			return r / fabs(wi.z);
		}
		// diffuse reflection
		isDirac = false;
		// wi from inner surface
		wi = sampler.cosSampleHemisphereSurface();
		pdf = (1-r) * wi.z / PI;
		if (wo.z<0) wi.z *= -1;
		return f(albedo, wo, wi);
		// wi = sampler.cosSampleHemisphereSurface();
		// pdf = wi.z/PI;
		// if (wo.z<0) wi.z *= -1;
		// return f(wo, wi);
		// // diffuse component only !!!!!!!
	}